

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

void __thiscall blc::math::Float::Float(Float *this,double i,int E)

{
  bool bVar1;
  undefined4 in_ESI;
  serializable *in_RDI;
  _func_int **in_XMM0_Qa;
  
  tools::serializable::serializable(in_RDI);
  in_RDI->_vptr_serializable = (_func_int **)&PTR_serialize_abi_cxx11__001309b8;
  in_RDI[1]._vptr_serializable = in_XMM0_Qa;
  *(undefined4 *)&in_RDI[2]._vptr_serializable = in_ESI;
  if (((double)in_RDI[1]._vptr_serializable != 0.0) || (NAN((double)in_RDI[1]._vptr_serializable)))
  {
    if ((1.0 < (double)in_RDI[1]._vptr_serializable) ||
       ((double)in_RDI[1]._vptr_serializable <= -1.0 && (double)in_RDI[1]._vptr_serializable != -1.0
       )) {
      while( true ) {
        bVar1 = true;
        if ((double)in_RDI[1]._vptr_serializable < 10.0) {
          bVar1 = (double)in_RDI[1]._vptr_serializable <= -10.0;
        }
        if (!bVar1) break;
        *(int *)&in_RDI[2]._vptr_serializable = *(int *)&in_RDI[2]._vptr_serializable + 1;
        in_RDI[1]._vptr_serializable = (_func_int **)((double)in_RDI[1]._vptr_serializable / 10.0);
      }
    }
    else {
      while( true ) {
        bVar1 = false;
        if ((double)in_RDI[1]._vptr_serializable <= 1.0 &&
            (double)in_RDI[1]._vptr_serializable != 1.0) {
          bVar1 = -1.0 < (double)in_RDI[1]._vptr_serializable;
        }
        if (!bVar1) break;
        *(int *)&in_RDI[2]._vptr_serializable = *(int *)&in_RDI[2]._vptr_serializable + -1;
        in_RDI[1]._vptr_serializable = (_func_int **)((double)in_RDI[1]._vptr_serializable * 10.0);
      }
    }
  }
  return;
}

Assistant:

blc::math::Float::Float(double i, int E) : _nb(i), _E(E) {
	if (this->_nb == 0)
		return;
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}